

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O0

long __thiscall cppcms::impl::file_server_detail::async_file_handler::go(async_file_handler *this)

{
  int iVar1;
  ulong uVar2;
  long extraout_RAX;
  response *prVar3;
  undefined4 extraout_var;
  char *__buf;
  context *in_stack_00000020;
  response *in_stack_00000118;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 enable;
  response *in_stack_ffffffffffffffb0;
  string *this_00;
  string local_28 [24];
  response *in_stack_fffffffffffffff0;
  long lVar4;
  
  enable = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  uVar2 = std::ios::operator!(&this->f + *(long *)(*(long *)&this->f + -0x18));
  if ((uVar2 & 1) == 0) {
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3e0973);
    http::context::response((context *)0x3e097b);
    http::response::full_asynchronous_buffering(in_stack_ffffffffffffffb0,(bool)enable);
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3e0996);
    http::context::response((context *)0x3e099e);
    http::response::out(in_stack_00000118);
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3e09b7);
    prVar3 = http::context::response((context *)0x3e09bf);
    http::response::setbuf(prVar3,(FILE *)0x0,__buf);
    iVar1 = (*(this->super_callable<void_(cppcms::http::context::completion_type)>).super_refcounted
              ._vptr_refcounted[2])(this,0);
    lVar4 = CONCAT44(extraout_var,iVar1);
  }
  else {
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3e08d5);
    http::context::response((context *)0x3e08dd);
    http::response::set_html_header(in_stack_fffffffffffffff0);
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3e08ee);
    prVar3 = http::context::response((context *)0x3e08f6);
    this_00 = local_28;
    std::__cxx11::string::string(this_00);
    http::response::make_error_response
              ((response *)this,(int)((ulong)this_00 >> 0x20),(string *)prVar3);
    std::__cxx11::string::~string(local_28);
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3e093b);
    http::context::async_complete_response(in_stack_00000020);
    lVar4 = extraout_RAX;
  }
  return lVar4;
}

Assistant:

void go()
	{
		if(!f) {
			ctx->response().set_html_header();
			ctx->response().make_error_response(404);
			ctx->async_complete_response();
		}
		else {
			ctx->response().full_asynchronous_buffering(false);
			ctx->response().out();
			ctx->response().setbuf(0);
			(*this)(cppcms::http::context::operation_completed);
		}
		
	}